

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Measurement.cpp
# Opt level: O1

void __thiscall
Measurement::Measurement(Measurement *this,Sensor *sensor,long timestamp,VectorXd *measurements)

{
  VectorXd *this_00;
  DenseIndex size_00;
  ulong uVar1;
  double *pdVar2;
  double *pdVar3;
  double dVar4;
  Index size;
  ulong uVar5;
  long lVar6;
  Matrix<double,__1,_1,_0,__1,_1> *other;
  
  this->_vptr_Measurement = (_func_int **)&PTR___cxa_pure_virtual_0014fb80;
  this->sensor_ = sensor;
  this->timestamp_ = timestamp;
  this_00 = &this->measurements_;
  size_00 = (measurements->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage
            .m_rows;
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
            ((DenseStorage<double,__1,__1,_1,_0> *)this_00,size_00,size_00,1);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
             (measurements->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
             m_storage.m_rows,1);
  uVar1 = (this->measurements_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
          m_storage.m_rows;
  if (uVar1 == (measurements->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
               m_storage.m_rows) {
    uVar5 = uVar1 - ((long)uVar1 >> 0x3f) & 0xfffffffffffffffe;
    if (1 < (long)uVar1) {
      lVar6 = 0;
      do {
        pdVar2 = (measurements->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                 m_storage.m_data + lVar6;
        dVar4 = pdVar2[1];
        pdVar3 = (this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage
                 .m_data + lVar6;
        *pdVar3 = *pdVar2;
        pdVar3[1] = dVar4;
        lVar6 = lVar6 + 2;
      } while (lVar6 < (long)uVar5);
    }
    if ((long)uVar5 < (long)uVar1) {
      pdVar2 = (measurements->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
               m_storage.m_data;
      pdVar3 = (this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
               m_data;
      do {
        pdVar3[uVar5] = pdVar2[uVar5];
        uVar5 = uVar5 + 1;
      } while (uVar1 != uVar5);
    }
    (this->estimate_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
    m_rows = 0;
    (this->ground_truth_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
    m_data = (double *)0x0;
    this->nis_ = 0.0;
    (this->estimate_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
    m_data = (double *)0x0;
    (this->ground_truth_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
    m_rows = 0;
    return;
  }
  __assert_fail("rows() == other.rows() && cols() == other.cols()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/Assign.h"
                ,0x1f9,
                "Derived &Eigen::DenseBase<Eigen::Matrix<double, -1, 1>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Matrix<double, -1, 1>, OtherDerived = Eigen::Matrix<double, -1, 1>]"
               );
}

Assistant:

Measurement::Measurement(const Sensor *sensor, long timestamp, const VectorXd& measurements) :
        sensor_(sensor),
	timestamp_(timestamp),
	measurements_(measurements),
	nis_(0.0)
{
    //std::cout << measurements_.transpose() << std::endl;
}